

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void ff_master(dw_rom *rom)

{
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  ulong in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  ulong in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  vpatch(rom,0x1335,0xf,3,0,0x43,CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),2),
         CONCAT44((int)((ulong)in_stack_ffffffffffffff70 >> 0x20),3),
         CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),3),
         CONCAT44((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),3),
         in_stack_ffffffffffffff88 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),3),
         in_stack_ffffffffffffff98 & 0xffffffff00000000,
         CONCAT44((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),0x43),
         CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),3),
         CONCAT44((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),0x43),
         CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),2),
         CONCAT44((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),0x43));
  vpatch(rom,0x1395,0xf,3,0xc,0x43,0xf,0x43,0xe,0x43,0xc,3,0xc,0x43,0xe,3,0xf,3);
  vpatch(rom,0x13b4,0x4f,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2,0x51,2,0x52,
         0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,
         0,0x50,2,0x51,2,0x52,0,0x53,0,0x54,2,0x55,2,0x56,0,0x57,0,0x50);
  vpatch(rom,0x1435,0xf,3,5,3,6,3,7,3,4,3,5,3,8,3,9,3);
  vpatch(rom,0x1495,0xf,3,0x11,3,0x14,3,0x15,3,0x10,3,0x11,3,0x12,3,0x13,3);
  vpatch(rom,0x14b4,0x14,0x48,2,0x49,2,0x4a,0,0x4b,0,0x4c,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0x49,2);
  vpatch(rom,0x14cd,0x1b,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0x49,2,0x4a,0,0x4b,0,0x4c,2,0x4d,2,0x4e,0,
         0x4f,0,0x48,2,0x49,2);
  vpatch(rom,0x14ed,0x14,2,0x4d,2,0x4e,0,0x4f,0,0x48,2,0xa9,2,0x4a,0,0xab,3,0x4c,2,0xad,2,0x4e);
  vpatch(rom,0x1535,0xf,3,1,0x43,10,3,0xb,3,1,3,1,0x43,0xb,0x43,10,0x43);
  vpatch(rom,0x1595,0xf,3,0xd,0x43,0x16,3,0x17,3,0xd,3,0xd,0x43,0x17,0x43,0x16,0x43);
  vpatch(rom,0x15b4,0x44,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0x30,2,0x31,2,0x32,
         0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,
         0,0x30,2,0x31,2,0x32,0,0x33,0,0x34,2,0x35,2,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,2,0x35,2);
  vpatch(rom,0x1635,0xf,0x43,4,0x43,7,0x43,6,0x43,5,0x43,4,0x43,9,0x43,8,0x43);
  vpatch(rom,0x1695,0xf,0x43,0x10,0x43,0x15,0x43,0x14,0x43,0x11,0x43,0x10,0x43,0x13,0x43,0x12,0x43);
  vpatch(rom,0x16b4,0x44,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0x40,2,0x41,2,0x42,
         0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,
         0,0x40,2,0x41,2,0x42,0,0x43,0,0x44,2,0x45,2,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,2,0x45,2);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,9,0x36,0xf,0x12,0x35,0x27,0x1a,0x37,0x28,0xf);
  vpatch(rom,0x12300,0x80);
  vpatch(rom,0x12400,0x180,0xf,0x10,8,0xc,0xe,0xf,0xf,0xf,0xf,0x1f,0xf,0xb,9,0xf,10,8,0xe0,0x10,8,8,
         8,8,0x90,0xf0,0xe0,0xf0,0xf8,0xf8,0xf8,0xf8,0x70,0xb0,1,6,0x17,0x17,3,1,1,3,0xe,0x19,0x2f,
         0x2f,0x17,3,3,7,0xf8,0xfc,0xbc,0xec,0xdc,0xc0,0xc0,0xc0,0x44,0x82,0xc2,0xf2,0xe2,0xfc,0xe0,
         0xe0,0);
  ff_spells(rom);
  return;
}

Assistant:

static void ff_master(dw_rom *rom)
{
    vpatch(rom, 0x01335,   15,  0x03,  0x00,  0x43,  0x02,  0x03,  0x03,  0x03,  0x00,  0x03,  0x00,  0x43,  0x03,  0x43,  0x02,  0x43);
    vpatch(rom, 0x01395,   15,  0x03,  0x0c,  0x43,  0x0f,  0x43,  0x0e,  0x43,  0x0c,  0x03,  0x0c,  0x43,  0x0e,  0x03,  0x0f,  0x03);
    vpatch(rom, 0x013b4,   79,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57,  0x00,  0x50,  0x02,  0x51,  0x02,  0x52,  0x00,  0x53,  0x00,  0x54,  0x02,  0x55,  0x02,  0x56,  0x00,  0x57);
    vpatch(rom, 0x01435,   15,  0x03,  0x05,  0x03,  0x06,  0x03,  0x07,  0x03,  0x04,  0x03,  0x05,  0x03,  0x08,  0x03,  0x09,  0x03);
    vpatch(rom, 0x01495,   15,  0x03,  0x11,  0x03,  0x14,  0x03,  0x15,  0x03,  0x10,  0x03,  0x11,  0x03,  0x12,  0x03,  0x13,  0x03);
    vpatch(rom, 0x014b4,   20,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02);
    vpatch(rom, 0x014cd,   27,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0x49,  0x02);
    vpatch(rom, 0x014ed,   20,  0x02,  0x4d,  0x02,  0x4e,  0x00,  0x4f,  0x00,  0x48,  0x02,  0xa9,  0x02,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x02,  0xad,  0x02,  0x4e);
    vpatch(rom, 0x01535,   15,  0x03,  0x01,  0x43,  0x0a,  0x03,  0x0b,  0x03,  0x01,  0x03,  0x01,  0x43,  0x0b,  0x43,  0x0a,  0x43);
    vpatch(rom, 0x01595,   15,  0x03,  0x0d,  0x43,  0x16,  0x03,  0x17,  0x03,  0x0d,  0x03,  0x0d,  0x43,  0x17,  0x43,  0x16,  0x43);
    vpatch(rom, 0x015b4,   68,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0x30,  0x02,  0x31,  0x02,  0x32,  0x00,  0x33,  0x00,  0x34,  0x02,  0x35,  0x02,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31,  0x02);
    vpatch(rom, 0x015fe,    2,  0x35,  0x02);
    vpatch(rom, 0x01635,   15,  0x43,  0x04,  0x43,  0x07,  0x43,  0x06,  0x43,  0x05,  0x43,  0x04,  0x43,  0x09,  0x43,  0x08,  0x43);
    vpatch(rom, 0x01695,   15,  0x43,  0x10,  0x43,  0x15,  0x43,  0x14,  0x43,  0x11,  0x43,  0x10,  0x43,  0x13,  0x43,  0x12,  0x43);
    vpatch(rom, 0x016b4,   68,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0x40,  0x02,  0x41,  0x02,  0x42,  0x00,  0x43,  0x00,  0x44,  0x02,  0x45,  0x02,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41,  0x02);
    vpatch(rom, 0x016fe,    2,  0x45,  0x02);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    9,  0x36,  0x0f,  0x12,  0x35,  0x27,  0x1a,  0x37,  0x28,  0x0f);
    vpatch(rom, 0x12300,  128,  0x0f,  0x10,  0x08,  0x0d,  0x0e,  0x0f,  0x7f,  0xff,  0x0f,  0x1f,  0x0f,  0x0a,  0x09,  0x0e,  0x7a,  0xc4,  0xe0,  0x10,  0x08,  0x08,  0x88,  0xe8,  0xfe,  0xff,  0xe0,  0xf0,  0xf8,  0xf8,  0x78,  0xf8,  0x5e,  0x23,  0x7c,  0x1f,  0x6f,  0x63,  0x07,  0x07,  0x07,  0x03,  0x8b,  0xec,  0x9f,  0x9f,  0x6f,  0x0f,  0x0f,  0x07,  0x3c,  0xfe,  0xe6,  0xe0,  0x00,  0x60,  0x00,  0x00,  0xd3,  0x31,  0xf9,  0xfe,  0xfc,  0xf0,  0xf8,  0xfc,  0x07,  0x08,  0x10,  0x10,  0x11,  0x17,  0x7f,  0xff,  0x07,  0x0f,  0x1f,  0x1f,  0x1e,  0x1f,  0x7a,  0xc4,  0xf0,  0x08,  0x10,  0xb0,  0x70,  0xf0,  0xfe,  0xff,  0xf0,  0xf8,  0xf0,  0x50,  0x90,  0x70,  0x5e,  0x23,  0x3c,  0x7f,  0x67,  0x07,  0x00,  0x06,  0x00,  0x00,  0xcb,  0x8c,  0x9f,  0x7f,  0x3f,  0x0f,  0x1f,  0x3f,  0x3e,  0xf8,  0xf6,  0xc6,  0xe0,  0xe0,  0xe0,  0xc0,  0xd1,  0x37,  0xf9,  0xf9,  0xf6,  0xf0,  0xf0,  0xe0);
    vpatch(rom, 0x12400,  384,  0x0f,  0x10,  0x08,  0x0c,  0x0e,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x0f,  0x0b,  0x09,  0x0f,  0x0a,  0x08,  0xe0,  0x10,  0x08,  0x08,  0x08,  0x08,  0x90,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0x70,  0xb0,  0x01,  0x06,  0x17,  0x17,  0x03,  0x01,  0x01,  0x03,  0x0e,  0x19,  0x2f,  0x2f,  0x17,  0x03,  0x03,  0x07,  0xf8,  0xfc,  0xbc,  0xec,  0xdc,  0xc0,  0xc0,  0xc0,  0x44,  0x82,  0xc2,  0xf2,  0xe2,  0xfc,  0xe0,  0xe0,  0x00,  0x0f,  0x10,  0x08,  0x0c,  0x0e,  0x0f,  0x0f,  0x00,  0x0f,  0x1f,  0x0f,  0x0b,  0x09,  0x0f,  0x0a,  0x00,  0xe0,  0x10,  0x08,  0x08,  0x08,  0x08,  0x90,  0x00,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0x70,  0x07,  0x00,  0x07,  0x07,  0x06,  0x02,  0x0f,  0x07,  0x08,  0x07,  0x08,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x40,  0xf0,  0xf8,  0xb8,  0xf8,  0x70,  0x80,  0x30,  0xb0,  0x48,  0x84,  0xc4,  0x04,  0x88,  0xf8,  0xfc,  0x00,  0x07,  0x08,  0x10,  0x10,  0x10,  0x10,  0x09,  0x00,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0e,  0x00,  0xf0,  0x08,  0x10,  0x30,  0x70,  0xf0,  0xf0,  0x00,  0xf0,  0xf8,  0xf0,  0xd0,  0x90,  0xf0,  0x50,  0x02,  0x0f,  0x1f,  0x1d,  0x1f,  0x0e,  0x01,  0x0c,  0x0d,  0x12,  0x21,  0x23,  0x20,  0x11,  0x1f,  0x3f,  0xe0,  0x00,  0xe0,  0xe0,  0x60,  0x40,  0xf0,  0xe0,  0x10,  0xe0,  0x10,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0x07,  0x08,  0x10,  0x10,  0x10,  0x10,  0x09,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x0e,  0x0d,  0xf0,  0x08,  0x10,  0x30,  0x70,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf0,  0xd0,  0x90,  0xf0,  0x50,  0x10,  0x1f,  0x3f,  0x3d,  0x37,  0x3b,  0x03,  0x03,  0x03,  0x22,  0x41,  0x43,  0x4f,  0x47,  0x3f,  0x07,  0x07,  0x80,  0x60,  0xe8,  0xe8,  0xc0,  0x80,  0x80,  0xc0,  0x70,  0x98,  0xf4,  0xf4,  0xe8,  0xc0,  0xc0,  0xe0,  0x07,  0x08,  0x10,  0x10,  0x10,  0x10,  0x3c,  0x7f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0x3b,  0x44,  0xf0,  0x08,  0x10,  0x10,  0x10,  0x10,  0x3c,  0xfe,  0xf0,  0xf8,  0xf0,  0xf0,  0xf0,  0xf0,  0xdc,  0x22,  0x3e,  0x1f,  0x0f,  0x07,  0x07,  0x07,  0x07,  0x03,  0x4f,  0x2f,  0x1f,  0x0f,  0x0f,  0x0f,  0x0f,  0x07,  0x7e,  0xfe,  0xe4,  0xe0,  0x00,  0x60,  0x00,  0x00,  0xf1,  0xf1,  0xfa,  0xfc,  0xf0,  0xf0,  0xf8,  0xfc,  0x0f,  0x10,  0x08,  0x08,  0x08,  0x08,  0x3c,  0x7f,  0x0f,  0x1f,  0x0f,  0x0f,  0x0f,  0x0f,  0x3b,  0x44,  0xe0,  0x10,  0x08,  0x08,  0x08,  0x08,  0x3c,  0xfe,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xf8,  0xdc,  0x22,  0x7e,  0x7f,  0x27,  0x07,  0x00,  0x06,  0x00,  0x00,  0x8f,  0x8f,  0x5f,  0x3f,  0x0f,  0x0f,  0x1f,  0x3f,  0x7c,  0xf8,  0xf0,  0xe0,  0xe0,  0xe0,  0xe0,  0xc0,  0xf2,  0xf4,  0xf8,  0xf0,  0xf0,  0xf0,  0xf0,  0xe0);
    ff_spells(rom);
}